

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O0

bool __thiscall
ctemplate::BaseArena::AdjustLastAlloc(BaseArena *this,void *last_alloc,size_t newsize)

{
  char *pcVar1;
  bool bVar2;
  char *old_freestart;
  size_t newsize_local;
  void *last_alloc_local;
  BaseArena *this_local;
  
  if ((last_alloc == (void *)0x0) || ((char *)last_alloc != this->last_alloc_)) {
    this_local._7_1_ = false;
  }
  else {
    bVar2 = false;
    if (this->last_alloc_ <= this->freestart_) {
      bVar2 = this->freestart_ <= this->last_alloc_ + this->block_size_;
    }
    if (!bVar2) {
      __assert_fail("freestart_ >= last_alloc_ && freestart_ <= last_alloc_ + block_size_",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/base/arena.cc"
                    ,0x15e,"bool ctemplate::BaseArena::AdjustLastAlloc(void *, const size_t)");
    }
    if (this->freestart_ + (this->remaining_ - (long)this->last_alloc_) < newsize) {
      this_local._7_1_ = false;
    }
    else {
      pcVar1 = this->freestart_;
      this->freestart_ = this->last_alloc_ + newsize;
      this->remaining_ = this->remaining_ - ((long)this->freestart_ - (long)pcVar1);
      this_local._7_1_ = true;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool BaseArena::AdjustLastAlloc(void *last_alloc, const size_t newsize) {
  // It's only legal to call this on the last thing you alloced.
  if (last_alloc == NULL || last_alloc != last_alloc_)  return false;
  // last_alloc_ should never point into a "big" block, w/ size >= block_size_
  assert(freestart_ >= last_alloc_ && freestart_ <= last_alloc_ + block_size_);
  assert(remaining_ >= 0);   // should be: it's a size_t!
  if (newsize > (freestart_ - last_alloc_) + remaining_)
    return false;  // not enough room, even after we get back last_alloc_ space
  const char* old_freestart = freestart_;   // where last alloc used to end
  freestart_ = last_alloc_ + newsize;       // where last alloc ends now
  remaining_ -= (freestart_ - old_freestart); // how much new space we've taken
  return true;
}